

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__zhuffman_decode(stbi__zbuf *a,stbi__zhuffman *z)

{
  uint uVar1;
  int s;
  int b;
  stbi__zhuffman *z_local;
  stbi__zbuf *a_local;
  
  if (a->num_bits < 0x10) {
    stbi__fill_bits(a);
  }
  uVar1 = (uint)z->fast[a->code_buffer & 0x1ff];
  if (uVar1 == 0) {
    a_local._4_4_ = stbi__zhuffman_decode_slowpath(a,z);
  }
  else {
    a->code_buffer = a->code_buffer >> ((byte)((int)uVar1 >> 9) & 0x1f);
    a->num_bits = a->num_bits - ((int)uVar1 >> 9);
    a_local._4_4_ = uVar1 & 0x1ff;
  }
  return a_local._4_4_;
}

Assistant:

stbi_inline static int stbi__zhuffman_decode(stbi__zbuf *a, stbi__zhuffman *z)
{
   int b,s;
   if (a->num_bits < 16) stbi__fill_bits(a);
   b = z->fast[a->code_buffer & STBI__ZFAST_MASK];
   if (b) {
      s = b >> 9;
      a->code_buffer >>= s;
      a->num_bits -= s;
      return b & 511;
   }
   return stbi__zhuffman_decode_slowpath(a, z);
}